

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void nc_compute_weights(int n,double x_min,double x_max,double *x,double *w)

{
  size_t __n;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  void *__s;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  uVar2 = (ulong)(uint)n;
  uVar12 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar12 = (long)n * 8;
  }
  __s = operator_new__(uVar12);
  if (0 < n) {
    __n = uVar2 * 8;
    lVar3 = uVar2 * 8 + -0x10;
    lVar4 = (ulong)(n - 2) + 1;
    uVar12 = 1;
    do {
      memset(__s,0,__n);
      *(undefined8 *)((long)__s + uVar12 * 8 + -8) = 0x3ff0000000000000;
      if (n != 1) {
        uVar5 = 2;
        uVar7 = 1;
        sVar9 = __n;
        pdVar8 = x + -2;
        uVar11 = uVar7;
        do {
          do {
            *(double *)((long)__s + (sVar9 - 8)) =
                 (*(double *)((long)__s + (sVar9 - 0x10)) - *(double *)((long)__s + (sVar9 - 8))) /
                 (*(double *)((long)pdVar8 + sVar9) - *(double *)((long)x + (sVar9 - 8)));
            uVar7 = uVar7 + 1;
            sVar9 = sVar9 - 8;
          } while (uVar7 < uVar2);
          uVar5 = uVar5 + 1;
          uVar7 = uVar11 + 1;
          pdVar8 = pdVar8 + -1;
          sVar9 = __n;
          uVar11 = uVar7;
        } while (uVar5 != n + 1);
        if (n != 1) {
          uVar5 = 1;
          pdVar8 = x + (uVar2 - 2);
          uVar11 = uVar2;
          do {
            if (uVar5 < uVar2) {
              dVar14 = *(double *)((long)__s + uVar2 * 8 + -8);
              lVar10 = 0;
              do {
                dVar14 = *(double *)((long)__s + lVar10 * 8 + lVar3) - dVar14 * pdVar8[lVar10];
                *(double *)((long)__s + lVar10 * 8 + lVar3) = dVar14;
                lVar10 = lVar10 + -1;
              } while (1 - uVar11 != lVar10);
            }
            uVar5 = uVar5 + 1;
            uVar11 = (ulong)((int)uVar11 - 1);
            pdVar8 = pdVar8 + -1;
          } while (uVar5 != uVar2);
        }
      }
      dVar13 = *(double *)((long)__s + (long)n * 8 + -8) / (double)n;
      lVar10 = lVar4;
      dVar14 = dVar13;
      if (n != 1) {
        do {
          dVar14 = dVar14 * x_min + *(double *)((long)__s + lVar10 * 8 + -8) / (double)(int)lVar10;
          lVar6 = lVar10 + -1;
          bVar1 = 0 < lVar10;
          lVar10 = lVar6;
        } while (lVar6 != 0 && bVar1);
      }
      lVar10 = lVar4;
      if (n != 1) {
        do {
          dVar13 = dVar13 * x_max + *(double *)((long)__s + lVar10 * 8 + -8) / (double)(int)lVar10;
          lVar6 = lVar10 + -1;
          bVar1 = 0 < lVar10;
          lVar10 = lVar6;
        } while (lVar6 != 0 && bVar1);
      }
      w[uVar12 - 1] = dVar13 * x_max - dVar14 * x_min;
      uVar12 = uVar12 + 1;
    } while (uVar12 != n + 1);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void nc_compute_weights ( int n, double x_min, double x_max, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NC_COMPUTE_WEIGHTS computes weights for a Newton-Cotes quadrature rule.
//
//  Discussion:
//
//    For the interval [X_MIN,X_MAX], the Newton-Cotes quadrature rule 
//    estimates
//
//      Integral ( X_MIN <= X <= X_MAX ) F(X) dX
//
//    using N abscissas X and weights W:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//    For the CLOSED rule, the abscissas include the end points.
//    For the OPEN rule, the abscissas do not include the end points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 June 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double X_MIN, X_MAX, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double yvala;
  double yvalb;

  d = new double[n];

  for ( i = 1; i <= n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 1; j <= n; j++ )
    {
      d[j-1] = 0.0;
    }
    d[i-1] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the left and
//  right endpoints.
//
    yvala = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvala = yvala * x_min + d[j] / double( j + 1 );
    }
    yvala = yvala * x_min;

    yvalb = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvalb = yvalb * x_max + d[j] / double( j + 1 );
    }
    yvalb = yvalb * x_max;

    w[i-1] = yvalb - yvala;
  }

  delete [] d;

  return;
}